

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

string * __thiscall antlr::charName_abi_cxx11_(string *__return_storage_ptr__,antlr *this,int ch)

{
  int iVar1;
  char cVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((uint)this == 0xffffffff) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"EOF","");
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    iVar1 = isprint((uint)this & 0xff);
    cVar2 = (char)__return_storage_ptr__;
    if (iVar1 == 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::push_back(cVar2);
      std::__cxx11::string::push_back(cVar2);
    }
    else {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::push_back(cVar2);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string charName(int ch)
{
	if (ch == EOF)
		return "EOF";
	else
	{
		ANTLR_USE_NAMESPACE(std)string s;

		// when you think you've seen it all.. an isprint that crashes...
		ch = ch & 0xFF;
#ifdef ANTLR_CCTYPE_NEEDS_STD
		if( ANTLR_USE_NAMESPACE(std)isprint( ch ) )
#else
		if( isprint( ch ) )
#endif
		{
			s.append("'");
			s += ch;
			s.append("'");
//			s += "'"+ch+"'";
		}
		else
		{
			s += "0x";

			unsigned int t = ch >> 4;
			if( t < 10 )
				s += t | 0x30;
			else
				s += t + 0x37;
			t = ch & 0xF;
			if( t < 10 )
				s += t | 0x30;
			else
				s += t + 0x37;
		}
		return s;
	}
}